

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Binary_(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
          *this)

{
  Position *this_00;
  char *pcVar1;
  byte *pbVar2;
  byte *pbVar3;
  
  pcVar1 = (this->m_position).m_pos;
  if (pcVar1 == (this->m_position).m_end) {
    return false;
  }
  if (*pcVar1 == '0') {
    this_00 = &this->m_position;
    Position::operator++(this_00);
    pbVar2 = (byte *)(this->m_position).m_pos;
    if ((pbVar2 != (byte *)(this->m_position).m_end) &&
       (m_alphabet._M_elems[6]._M_elems[*pbVar2] == true)) {
      Position::operator++(this_00);
      pbVar2 = (byte *)(this->m_position).m_pos;
      pbVar3 = (byte *)(this->m_position).m_end;
      if ((pbVar2 != pbVar3) && (m_alphabet._M_elems[7]._M_elems[*pbVar2] == true)) {
        while( true ) {
          if (pbVar2 == pbVar3) {
            return true;
          }
          if (m_alphabet._M_elems[7]._M_elems[*pbVar2] != true) break;
          Position::operator++(this_00);
          pbVar2 = (byte *)(this->m_position).m_pos;
          pbVar3 = (byte *)(this->m_position).m_end;
        }
        return true;
      }
    }
    Position::operator--(this_00);
  }
  return false;
}

Assistant:

constexpr bool has_more() const noexcept { return m_pos != m_end; }